

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::pushTask
          (Walker<Scanner,_wasm::Visitor<Scanner,_void>_> *this,TaskFunc func,Expression **currp)

{
  pointer pTVar1;
  pointer this_00;
  pointer pTVar2;
  pointer pTVar3;
  ulong uVar4;
  pointer pTVar5;
  pointer pTVar6;
  Expression **extraout_RDX;
  Expression **__n;
  ulong uVar7;
  ulong uVar8;
  
  if (*currp == (Expression *)0x0) {
    __assert_fail("*currp",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x11e,
                  "void wasm::Walker<Scanner, wasm::Visitor<Scanner>>::pushTask(TaskFunc, Expression **) [SubType = Scanner, VisitorType = wasm::Visitor<Scanner>]"
                 );
  }
  uVar4 = (this->stack).usedFixed;
  if (uVar4 < 10) {
    (this->stack).usedFixed = uVar4 + 1;
    (this->stack).fixed._M_elems[uVar4].func = (TaskFunc_conflict)func;
    (this->stack).fixed._M_elems[uVar4].currp = currp;
  }
  else {
    pTVar1 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar1 == (this->stack).flexible.
                  super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_00 = (this->stack).flexible.
                super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pTVar1 - (long)this_00 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar7 = (long)pTVar1 - (long)this_00 >> 4;
      uVar4 = 1;
      if (pTVar1 != this_00) {
        uVar4 = uVar7;
      }
      uVar8 = uVar4 + uVar7;
      if (0x7fffffffffffffe < uVar8) {
        uVar8 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar4,uVar7)) {
        uVar8 = 0x7ffffffffffffff;
      }
      if (uVar8 == 0) {
        pTVar5 = (pointer)0x0;
        __n = currp;
      }
      else {
        pTVar5 = (pointer)operator_new(uVar8 << 4);
        __n = extraout_RDX;
      }
      pTVar5[uVar7].func = func;
      pTVar5[uVar7].currp = currp;
      pTVar2 = pTVar5;
      for (pTVar6 = this_00; pTVar6 != pTVar1; pTVar6 = pTVar6 + 1) {
        pTVar3 = (pointer)pTVar6->currp;
        pTVar2->func = (TaskFunc)(((_Vector_impl *)&pTVar6->func)->super__Vector_impl_data)._M_start
        ;
        pTVar2->currp = (Expression **)pTVar3;
        pTVar2 = pTVar2 + 1;
      }
      std::
      _Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ::_M_deallocate((_Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                       *)this_00,
                      (pointer)((long)(this->stack).flexible.
                                      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)this_00 >> 4),(size_t)__n);
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = pTVar5;
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar2 + 1;
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar5 + uVar8;
    }
    else {
      (((_Vector_impl *)&pTVar1->func)->super__Vector_impl_data)._M_start = (pointer)func;
      pTVar1->currp = currp;
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::Visitor<Scanner,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar1 + 1;
    }
  }
  return;
}

Assistant:

void pushTask(TaskFunc func, Expression** currp) {
    assert(*currp);
    stack.emplace_back(func, currp);
  }